

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

QDate __thiscall
QtPrivate::QCalendarDayValidator::applyToDate
          (undefined8 param_1,undefined8 param_2,undefined8 param_3)

{
  ulong uVar1;
  QDate QVar2;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  
  local_28._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = param_3;
  uVar1 = QCalendar::partsFromDate((QDate)local_28);
  if (uVar1 >> 0x20 == 0x80000000) {
    QVar2.jd = -0x8000000000000000;
  }
  else {
    QCalendar::daysInMonth((int)(YearMonthDay *)local_28,(int)(uVar1 >> 0x20));
    QVar2.jd = QCalendar::dateFromParts((YearMonthDay *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28._8_8_) {
    return (QDate)QVar2.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QCalendarDayValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    parts.day = qMin(qMax(1, m_day), cal.daysInMonth(parts.month, parts.year));
    return cal.dateFromParts(parts);
}